

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_cross_entropy_loss_back(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ulong uVar8;
  void *pvVar9;
  size_t sVar10;
  void *pvVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  byte bVar25;
  byte bVar26;
  char cVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  void *pvVar31;
  long lVar32;
  char *pcVar33;
  ulong uVar34;
  float *x;
  long lVar35;
  float *y;
  long lVar36;
  undefined8 uVar37;
  uint n;
  int np;
  uint uVar38;
  ushort uVar39;
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  ggml_float gVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  
  pgVar5 = dst->src[0];
  if (pgVar5->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x2212,"fatal error");
  }
  pgVar6 = dst->src[2];
  pgVar7 = dst->src[1];
  cVar27 = ggml_is_contiguous(dst);
  if (cVar27 == '\0') {
    pcVar33 = "ggml_is_contiguous(dst)";
    uVar37 = 0x21ce;
  }
  else {
    cVar27 = ggml_is_contiguous(pgVar7);
    if (cVar27 == '\0') {
      pcVar33 = "ggml_is_contiguous(src0f)";
      uVar37 = 0x21cf;
    }
    else {
      cVar27 = ggml_is_contiguous(pgVar6);
      if (cVar27 == '\0') {
        pcVar33 = "ggml_is_contiguous(src1f)";
        uVar37 = 0x21d0;
      }
      else {
        cVar27 = ggml_is_contiguous(pgVar5);
        if (cVar27 == '\0') {
          pcVar33 = "ggml_is_contiguous(grad)";
          uVar37 = 0x21d1;
        }
        else {
          cVar27 = ggml_are_same_shape(pgVar7,pgVar6);
          if (cVar27 != '\0') {
            cVar27 = ggml_are_same_shape(pgVar7,dst);
            if (cVar27 != '\0') {
              iVar3 = params->ith;
              iVar4 = params->nth;
              uVar8 = pgVar7->ne[0];
              lVar28 = ggml_nrows(pgVar7);
              lVar29 = ((long)iVar4 + -1 + lVar28) / (long)iVar4;
              lVar36 = iVar3 * lVar29;
              lVar29 = lVar29 + lVar36;
              if (lVar28 <= lVar29) {
                lVar29 = lVar28;
              }
              if (lVar36 < lVar29) {
                n = (uint)uVar8;
                uVar38 = n & 0xffffffc0;
                lVar32 = (long)(int)uVar38;
                auVar48._0_4_ = *pgVar5->data / (float)lVar28;
                auVar48._4_12_ = SUB6012((undefined1  [60])0x0,0);
                lVar28 = (long)(int)n;
                if ((long)(int)n < lVar32 + 1) {
                  lVar28 = lVar32 + 1;
                }
                auVar40 = vpbroadcastq_avx512f();
                uVar34 = (lVar28 - lVar32) + 0xfU & 0xfffffffffffffff0;
                auVar40 = vmovdqu64_avx512f(auVar40);
                auVar41 = vbroadcastss_avx512f(auVar48);
                do {
                  auVar48 = SUB6416(ZEXT464(0xff800000),0);
                  x = (float *)(pgVar7->nb[1] * lVar36 + (long)pgVar7->data);
                  if (0 < (int)n) {
                    auVar50 = ZEXT464(0xff800000);
                    uVar30 = 0;
                    do {
                      auVar48 = vmaxss_avx(auVar50._0_16_,ZEXT416((uint)x[uVar30]));
                      auVar50 = ZEXT1664(auVar48);
                      uVar30 = uVar30 + 1;
                    } while ((n & 0x7fffffff) != uVar30);
                  }
                  pvVar9 = dst->data;
                  sVar10 = pgVar6->nb[1];
                  lVar28 = dst->nb[1] * lVar36;
                  pvVar11 = pgVar6->data;
                  y = (float *)((long)pvVar9 + lVar28);
                  gVar47 = ggml_vec_soft_max_f32(n,y,x,auVar48._0_4_);
                  auVar50 = vmovdqu64_avx512f(auVar40);
                  auVar42 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar49._0_4_ = (float)(1.0 / gVar47);
                  auVar49._4_4_ = (int)((ulong)(1.0 / gVar47) >> 0x20);
                  auVar49._8_8_ = 0;
                  auVar44 = vbroadcastss_avx512f(auVar49);
                  if (0 < (int)uVar38) {
                    pvVar31 = (void *)((long)pvVar9 + lVar28);
                    uVar30 = 0;
                    do {
                      lVar35 = 0;
                      do {
                        auVar45 = vmulps_avx512f(auVar44,*(undefined1 (*) [64])
                                                          ((long)pvVar31 + lVar35));
                        *(undefined1 (*) [64])((long)pvVar31 + lVar35) = auVar45;
                        lVar35 = lVar35 + 0x40;
                      } while (lVar35 != 0x100);
                      uVar30 = uVar30 + 0x40;
                      pvVar31 = (void *)((long)pvVar31 + 0x100);
                    } while (uVar30 < uVar38);
                  }
                  if (uVar38 != n) {
                    uVar30 = 0;
                    lVar35 = lVar28 + lVar32 * 4;
                    do {
                      auVar45 = vpbroadcastq_avx512f();
                      auVar46 = vporq_avx512f(auVar45,auVar42);
                      auVar45 = vporq_avx512f(auVar45,auVar43);
                      uVar37 = vpcmpuq_avx512f(auVar45,auVar50,2);
                      bVar25 = (byte)uVar37;
                      uVar37 = vpcmpuq_avx512f(auVar46,auVar50,2);
                      bVar26 = (byte)uVar37;
                      uVar39 = CONCAT11(bVar26,bVar25);
                      piVar1 = (int *)((long)pvVar9 + uVar30 * 4 + lVar35);
                      auVar45._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * piVar1[1];
                      auVar45._0_4_ = (uint)(bVar25 & 1) * *piVar1;
                      auVar45._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * piVar1[2];
                      auVar45._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * piVar1[3];
                      auVar45._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * piVar1[4];
                      auVar45._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * piVar1[5];
                      auVar45._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * piVar1[6];
                      auVar45._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * piVar1[7];
                      auVar45._32_4_ = (uint)(bVar26 & 1) * piVar1[8];
                      auVar45._36_4_ = (uint)(bVar26 >> 1 & 1) * piVar1[9];
                      auVar45._40_4_ = (uint)(bVar26 >> 2 & 1) * piVar1[10];
                      auVar45._44_4_ = (uint)(bVar26 >> 3 & 1) * piVar1[0xb];
                      auVar45._48_4_ = (uint)(bVar26 >> 4 & 1) * piVar1[0xc];
                      auVar45._52_4_ = (uint)(bVar26 >> 5 & 1) * piVar1[0xd];
                      auVar45._56_4_ = (uint)(bVar26 >> 6 & 1) * piVar1[0xe];
                      auVar45._60_4_ = (uint)(bVar26 >> 7) * piVar1[0xf];
                      auVar45 = vmulps_avx512f(auVar45,auVar44);
                      puVar2 = (uint *)((long)pvVar9 + uVar30 * 4 + lVar35);
                      bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar39 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar39 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar39 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar39 >> 7) & 1);
                      bVar19 = (bool)(bVar26 >> 1 & 1);
                      bVar20 = (bool)(bVar26 >> 2 & 1);
                      bVar21 = (bool)(bVar26 >> 3 & 1);
                      bVar22 = (bool)(bVar26 >> 4 & 1);
                      bVar23 = (bool)(bVar26 >> 5 & 1);
                      bVar24 = (bool)(bVar26 >> 6 & 1);
                      *puVar2 = (uint)(bVar25 & 1) * auVar45._0_4_ |
                                (uint)!(bool)(bVar25 & 1) * *puVar2;
                      puVar2[1] = (uint)bVar12 * auVar45._4_4_ | (uint)!bVar12 * puVar2[1];
                      puVar2[2] = (uint)bVar13 * auVar45._8_4_ | (uint)!bVar13 * puVar2[2];
                      puVar2[3] = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * puVar2[3];
                      puVar2[4] = (uint)bVar15 * auVar45._16_4_ | (uint)!bVar15 * puVar2[4];
                      puVar2[5] = (uint)bVar16 * auVar45._20_4_ | (uint)!bVar16 * puVar2[5];
                      puVar2[6] = (uint)bVar17 * auVar45._24_4_ | (uint)!bVar17 * puVar2[6];
                      puVar2[7] = (uint)bVar18 * auVar45._28_4_ | (uint)!bVar18 * puVar2[7];
                      puVar2[8] = (uint)(bVar26 & 1) * auVar45._32_4_ |
                                  (uint)!(bool)(bVar26 & 1) * puVar2[8];
                      puVar2[9] = (uint)bVar19 * auVar45._36_4_ | (uint)!bVar19 * puVar2[9];
                      puVar2[10] = (uint)bVar20 * auVar45._40_4_ | (uint)!bVar20 * puVar2[10];
                      puVar2[0xb] = (uint)bVar21 * auVar45._44_4_ | (uint)!bVar21 * puVar2[0xb];
                      puVar2[0xc] = (uint)bVar22 * auVar45._48_4_ | (uint)!bVar22 * puVar2[0xc];
                      puVar2[0xd] = (uint)bVar23 * auVar45._52_4_ | (uint)!bVar23 * puVar2[0xd];
                      puVar2[0xe] = (uint)bVar24 * auVar45._56_4_ | (uint)!bVar24 * puVar2[0xe];
                      puVar2[0xf] = (uint)(bVar26 >> 7) * auVar45._60_4_ |
                                    (uint)!(bool)(bVar26 >> 7) * puVar2[0xf];
                      uVar30 = uVar30 + 0x10;
                    } while (uVar34 != uVar30);
                  }
                  if (0 < (int)n) {
                    uVar30 = 0;
                    do {
                      *(float *)((long)pvVar9 + uVar30 * 4 + lVar28) =
                           *(float *)((long)pvVar9 + uVar30 * 4 + lVar28) -
                           *(float *)((long)pvVar11 + uVar30 * 4 + sVar10 * lVar36);
                      uVar30 = uVar30 + 1;
                    } while ((n & 0x7fffffff) != uVar30);
                  }
                  if ((uVar8 & 0xffffffc0) != 0 && -1 < (int)uVar38) {
                    uVar30 = 0;
                    do {
                      lVar35 = 0;
                      do {
                        auVar44 = vmulps_avx512f(auVar41,*(undefined1 (*) [64])((long)y + lVar35));
                        *(undefined1 (*) [64])((long)y + lVar35) = auVar44;
                        lVar35 = lVar35 + 0x40;
                      } while (lVar35 != 0x100);
                      uVar30 = uVar30 + 0x40;
                      y = y + 0x40;
                    } while (uVar30 < uVar38);
                  }
                  if (uVar38 != n) {
                    uVar30 = 0;
                    lVar28 = lVar28 + lVar32 * 4;
                    do {
                      auVar44 = vpbroadcastq_avx512f();
                      auVar45 = vporq_avx512f(auVar44,auVar42);
                      auVar44 = vporq_avx512f(auVar44,auVar43);
                      uVar37 = vpcmpuq_avx512f(auVar44,auVar50,2);
                      bVar25 = (byte)uVar37;
                      uVar37 = vpcmpuq_avx512f(auVar45,auVar50,2);
                      bVar26 = (byte)uVar37;
                      uVar39 = CONCAT11(bVar26,bVar25);
                      piVar1 = (int *)((long)pvVar9 + uVar30 * 4 + lVar28);
                      auVar44._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * piVar1[1];
                      auVar44._0_4_ = (uint)(bVar25 & 1) * *piVar1;
                      auVar44._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * piVar1[2];
                      auVar44._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * piVar1[3];
                      auVar44._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * piVar1[4];
                      auVar44._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * piVar1[5];
                      auVar44._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * piVar1[6];
                      auVar44._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * piVar1[7];
                      auVar44._32_4_ = (uint)(bVar26 & 1) * piVar1[8];
                      auVar44._36_4_ = (uint)(bVar26 >> 1 & 1) * piVar1[9];
                      auVar44._40_4_ = (uint)(bVar26 >> 2 & 1) * piVar1[10];
                      auVar44._44_4_ = (uint)(bVar26 >> 3 & 1) * piVar1[0xb];
                      auVar44._48_4_ = (uint)(bVar26 >> 4 & 1) * piVar1[0xc];
                      auVar44._52_4_ = (uint)(bVar26 >> 5 & 1) * piVar1[0xd];
                      auVar44._56_4_ = (uint)(bVar26 >> 6 & 1) * piVar1[0xe];
                      auVar44._60_4_ = (uint)(bVar26 >> 7) * piVar1[0xf];
                      auVar44 = vmulps_avx512f(auVar41,auVar44);
                      puVar2 = (uint *)((long)pvVar9 + uVar30 * 4 + lVar28);
                      bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar39 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar39 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar39 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar39 >> 7) & 1);
                      bVar19 = (bool)(bVar26 >> 1 & 1);
                      bVar20 = (bool)(bVar26 >> 2 & 1);
                      bVar21 = (bool)(bVar26 >> 3 & 1);
                      bVar22 = (bool)(bVar26 >> 4 & 1);
                      bVar23 = (bool)(bVar26 >> 5 & 1);
                      bVar24 = (bool)(bVar26 >> 6 & 1);
                      *puVar2 = (uint)(bVar25 & 1) * auVar44._0_4_ |
                                (uint)!(bool)(bVar25 & 1) * *puVar2;
                      puVar2[1] = (uint)bVar12 * auVar44._4_4_ | (uint)!bVar12 * puVar2[1];
                      puVar2[2] = (uint)bVar13 * auVar44._8_4_ | (uint)!bVar13 * puVar2[2];
                      puVar2[3] = (uint)bVar14 * auVar44._12_4_ | (uint)!bVar14 * puVar2[3];
                      puVar2[4] = (uint)bVar15 * auVar44._16_4_ | (uint)!bVar15 * puVar2[4];
                      puVar2[5] = (uint)bVar16 * auVar44._20_4_ | (uint)!bVar16 * puVar2[5];
                      puVar2[6] = (uint)bVar17 * auVar44._24_4_ | (uint)!bVar17 * puVar2[6];
                      puVar2[7] = (uint)bVar18 * auVar44._28_4_ | (uint)!bVar18 * puVar2[7];
                      puVar2[8] = (uint)(bVar26 & 1) * auVar44._32_4_ |
                                  (uint)!(bool)(bVar26 & 1) * puVar2[8];
                      puVar2[9] = (uint)bVar19 * auVar44._36_4_ | (uint)!bVar19 * puVar2[9];
                      puVar2[10] = (uint)bVar20 * auVar44._40_4_ | (uint)!bVar20 * puVar2[10];
                      puVar2[0xb] = (uint)bVar21 * auVar44._44_4_ | (uint)!bVar21 * puVar2[0xb];
                      puVar2[0xc] = (uint)bVar22 * auVar44._48_4_ | (uint)!bVar22 * puVar2[0xc];
                      puVar2[0xd] = (uint)bVar23 * auVar44._52_4_ | (uint)!bVar23 * puVar2[0xd];
                      puVar2[0xe] = (uint)bVar24 * auVar44._56_4_ | (uint)!bVar24 * puVar2[0xe];
                      puVar2[0xf] = (uint)(bVar26 >> 7) * auVar44._60_4_ |
                                    (uint)!(bool)(bVar26 >> 7) * puVar2[0xf];
                      uVar30 = uVar30 + 0x10;
                    } while (uVar34 != uVar30);
                  }
                  lVar36 = lVar36 + 1;
                } while (lVar36 != lVar29);
              }
              return;
            }
          }
          pcVar33 = "ggml_are_same_shape(src0f, src1f) && ggml_are_same_shape(src0f, dst)";
          uVar37 = 0x21d2;
        }
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar37,"GGML_ASSERT(%s) failed",pcVar33);
}

Assistant:

void ggml_compute_forward_cross_entropy_loss_back(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_cross_entropy_loss_back_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}